

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

bool Js::JavascriptOperators::IsConstructor(RecyclableObject *instanceObj)

{
  bool bVar1;
  int iVar2;
  JavascriptProxy *instance;
  JavascriptFunction *pJVar3;
  
  bVar1 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(instanceObj);
  if (bVar1) {
    instance = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(instanceObj);
  }
  else {
    instance = (JavascriptProxy *)0x0;
  }
  if (instance != (JavascriptProxy *)0x0) {
    bVar1 = IsConstructor(instance);
    return bVar1;
  }
  bVar1 = VarIsImpl<Js::JavascriptFunction>(instanceObj);
  if (bVar1) {
    pJVar3 = UnsafeVarTo<Js::JavascriptFunction,Js::RecyclableObject>(instanceObj);
  }
  else {
    pJVar3 = (JavascriptFunction *)0x0;
  }
  if (pJVar3 == (JavascriptFunction *)0x0) {
    bVar1 = false;
  }
  else {
    iVar2 = (*(pJVar3->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])();
    bVar1 = iVar2 != 0;
  }
  return bVar1;
}

Assistant:

bool JavascriptOperators::IsConstructor(_In_ RecyclableObject* instanceObj)
    {
        JavascriptProxy* proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(instanceObj);
        if (proxy)
        {
            return IsConstructor(proxy);
        }

        JavascriptFunction* function = JavascriptOperators::TryFromVar<JavascriptFunction>(instanceObj);
        return function && function->IsConstructor();
    }